

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatetimeParser.cpp
# Opt level: O3

bool __thiscall DatetimeParser::initializeEonww(DatetimeParser *this,Pig *pig)

{
  bool bVar1;
  uint c;
  size_type previous;
  tm *__tp;
  time_t tVar2;
  time_t now;
  string local_50;
  
  previous = Pig::cursor(pig);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"eonww","");
  bVar1 = Pig::skipLiteral(pig,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    c = Pig::peek(pig);
    bVar1 = unicodeLatinAlpha(c);
    if ((!bVar1) && (bVar1 = unicodeLatinDigit(c), !bVar1)) {
      local_50._M_dataplus._M_p = (pointer)time((time_t *)0x0);
      __tp = localtime((time_t *)&local_50);
      __tp->tm_mday = (__tp->tm_mday - __tp->tm_wday) + 0xd;
      __tp->tm_sec = 0;
      __tp->tm_min = 0;
      __tp->tm_hour = 0;
      __tp->tm_isdst = -1;
      tVar2 = mktime(__tp);
      this->_date = tVar2;
      return true;
    }
  }
  Pig::restoreTo(pig,previous);
  return false;
}

Assistant:

bool DatetimeParser::initializeEonww (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  if (pig.skipLiteral ("eonww"))
  {
    auto following = pig.peek ();
    if (! unicodeLatinAlpha (following) &&
        ! unicodeLatinDigit (following))
    {
      time_t now = time (nullptr);
      struct tm* t = localtime (&now);

      t->tm_mday += 13 - t->tm_wday;
      t->tm_hour = t->tm_min = t->tm_sec = 0;
      t->tm_isdst = -1;
      _date = mktime (t);
      return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}